

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

ImGuiWindow * FindWindowNavFocusable(int i_start,int i_stop,int dir)

{
  ImGuiContext *pIVar1;
  ImGuiWindow **ppIVar2;
  bool bVar3;
  int local_2c;
  int i;
  ImGuiContext *g;
  int dir_local;
  int i_stop_local;
  int i_start_local;
  
  pIVar1 = GImGui;
  local_2c = i_start;
  while( true ) {
    bVar3 = false;
    if ((-1 < local_2c) && (bVar3 = false, local_2c < (pIVar1->WindowsFocusOrder).Size)) {
      bVar3 = local_2c != i_stop;
    }
    if (!bVar3) break;
    ppIVar2 = ImVector<ImGuiWindow_*>::operator[](&pIVar1->WindowsFocusOrder,local_2c);
    bVar3 = ImGui::IsWindowNavFocusable(*ppIVar2);
    if (bVar3) {
      ppIVar2 = ImVector<ImGuiWindow_*>::operator[](&pIVar1->WindowsFocusOrder,local_2c);
      return *ppIVar2;
    }
    local_2c = dir + local_2c;
  }
  return (ImGuiWindow *)0x0;
}

Assistant:

static ImGuiWindow* FindWindowNavFocusable(int i_start, int i_stop, int dir) // FIXME-OPT O(N)
{
    ImGuiContext& g = *GImGui;
    for (int i = i_start; i >= 0 && i < g.WindowsFocusOrder.Size && i != i_stop; i += dir)
        if (ImGui::IsWindowNavFocusable(g.WindowsFocusOrder[i]))
            return g.WindowsFocusOrder[i];
    return NULL;
}